

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

string * __thiscall bf_crc::feed_type_to_str_abi_cxx11_(bf_crc *this,FEED_TYPE feed_type)

{
  allocator<char> *__a;
  uint in_EDX;
  string *in_RDI;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_15 [21];
  
  __a = (allocator<char> *)(ulong)in_EDX;
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator(local_15);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd9);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

std::string bf_crc::feed_type_to_str(my_crc_basic::FEED_TYPE feed_type) { 
  switch(feed_type) {
  case my_crc_basic::AUTO: return "auto";
  case my_crc_basic::LINEAR_FORWARD: return "linear-forward";
  case my_crc_basic::LINEAR_REVERSED: return "linear-reversed";
  case my_crc_basic::BYTEWISE_REVERSED: return "bytewise-reversed";
  default: return "undefined";
  }
}